

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

string * __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadLine_abi_cxx11_
          (string *__return_storage_ptr__,OgreBinarySerializer *this)

{
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
      return __return_storage_ptr__;
    }
    cVar1 = Read<char>(this);
    if (cVar1 == '\n') break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OgreBinarySerializer::ReadLine()
{
    std::string str;
    while(!AtEnd())
    {
        char c = Read<char>();
        if (c == '\n')
            break;
        str += c;
    }
    return str;
}